

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_meshlink.c
# Opt level: O0

REF_STATUS ref_meshlink_infer_orientation(REF_GRID ref_grid)

{
  uint uVar1;
  REF_STATUS RVar2;
  REF_INT *pRVar3;
  double local_110;
  REF_DBL local_108;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_INT ref_malloc_init_i;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT nodes [27];
  int local_64;
  uint local_60;
  REF_INT cell;
  REF_INT positive;
  REF_INT negative;
  REF_DBL max_normdev;
  REF_DBL min_normdev;
  REF_DBL normdev;
  int local_38;
  REF_INT id;
  REF_INT max_id;
  REF_INT min_id;
  REF_CELL ref_cell;
  REF_GEOM ref_geom;
  REF_MPI ref_mpi;
  REF_GRID ref_grid_local;
  
  ref_geom = (REF_GEOM)ref_grid->mpi;
  ref_cell = (REF_CELL)ref_grid->geom;
  _max_id = ref_grid->cell[3];
  ref_mpi = (REF_MPI)ref_grid;
  uVar1 = ref_cell_id_range(_max_id,(REF_MPI)ref_geom,&id,&local_38);
  if (uVar1 == 0) {
    if (id < 1) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_meshlink.c",
             0x3c7,"ref_meshlink_infer_orientation","expected min_id greater then zero");
      ref_grid_local._4_4_ = 1;
    }
    else {
      ref_cell[1].n = local_38;
      if (ref_cell[1].n < 0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_meshlink.c",
               0x3c9,"ref_meshlink_infer_orientation",
               "malloc ref_geom->uv_area_sign of REF_DBL negative");
        ref_grid_local._4_4_ = 1;
      }
      else {
        pRVar3 = (REF_INT *)malloc((long)ref_cell[1].n << 3);
        ref_cell->f2n = pRVar3;
        if (ref_cell->f2n == (REF_INT *)0x0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_meshlink.c"
                 ,0x3c9,"ref_meshlink_infer_orientation",
                 "malloc ref_geom->uv_area_sign of REF_DBL NULL");
          ref_grid_local._4_4_ = 2;
        }
        else {
          for (ref_private_macro_code_rss_2 = 0; ref_private_macro_code_rss_2 < ref_cell[1].n;
              ref_private_macro_code_rss_2 = ref_private_macro_code_rss_2 + 1) {
            pRVar3 = ref_cell->f2n;
            (pRVar3 + (long)ref_private_macro_code_rss_2 * 2)[0] = 0;
            (pRVar3 + (long)ref_private_macro_code_rss_2 * 2)[1] = 0x3ff00000;
          }
          for (normdev._4_4_ = id; (int)normdev._4_4_ <= local_38; normdev._4_4_ = normdev._4_4_ + 1
              ) {
            max_normdev = 2.0;
            _positive = -2.0;
            cell = 0;
            local_60 = 0;
            for (local_64 = 0; local_64 < _max_id->max; local_64 = local_64 + 1) {
              RVar2 = ref_cell_nodes(_max_id,local_64,&ref_malloc_init_i);
              if ((RVar2 == 0) && (normdev._4_4_ == (&ref_malloc_init_i)[_max_id->node_per])) {
                uVar1 = ref_geom_tri_norm_deviation
                                  ((REF_GRID)ref_mpi,&ref_malloc_init_i,&min_normdev);
                if (uVar1 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_meshlink.c"
                         ,0x3d2,"ref_meshlink_infer_orientation",(ulong)uVar1,"norm dev");
                  return uVar1;
                }
                if (min_normdev <= max_normdev) {
                  local_108 = min_normdev;
                }
                else {
                  local_108 = max_normdev;
                }
                max_normdev = local_108;
                if (_positive <= min_normdev) {
                  local_110 = min_normdev;
                }
                else {
                  local_110 = _positive;
                }
                _positive = local_110;
                if (0.0 <= min_normdev) {
                  local_60 = local_60 + 1;
                }
                else {
                  cell = cell + 1;
                }
              }
            }
            min_normdev = max_normdev;
            uVar1 = ref_mpi_min((REF_MPI)ref_geom,&min_normdev,&max_normdev,3);
            if (uVar1 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_meshlink.c"
                     ,0x3dc,"ref_meshlink_infer_orientation",(ulong)uVar1,"mpi max");
              return uVar1;
            }
            uVar1 = ref_mpi_bcast((REF_MPI)ref_geom,&max_normdev,1,3);
            if (uVar1 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_meshlink.c"
                     ,0x3dd,"ref_meshlink_infer_orientation",(ulong)uVar1,"min");
              return uVar1;
            }
            min_normdev = _positive;
            uVar1 = ref_mpi_max((REF_MPI)ref_geom,&min_normdev,&positive,3);
            if (uVar1 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_meshlink.c"
                     ,0x3df,"ref_meshlink_infer_orientation",(ulong)uVar1,"mpi max");
              return uVar1;
            }
            uVar1 = ref_mpi_bcast((REF_MPI)ref_geom,&positive,1,3);
            if (uVar1 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_meshlink.c"
                     ,0x3e0,"ref_meshlink_infer_orientation",(ulong)uVar1,"max");
              return uVar1;
            }
            uVar1 = ref_mpi_allsum((REF_MPI)ref_geom,&local_60,1,1);
            if (uVar1 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_meshlink.c"
                     ,0x3e1,"ref_meshlink_infer_orientation",(ulong)uVar1,"mpi sum");
              return uVar1;
            }
            uVar1 = ref_mpi_allsum((REF_MPI)ref_geom,&cell,1,1);
            if (uVar1 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_meshlink.c"
                     ,0x3e2,"ref_meshlink_infer_orientation",(ulong)uVar1,"mpi sum");
              return uVar1;
            }
            if ((max_normdev <= 1.5) || (-1.5 <= _positive)) {
              if ((int)local_60 < cell) {
                pRVar3 = ref_cell->f2n;
                (pRVar3 + (long)(int)(normdev._4_4_ - 1) * 2)[0] = 0;
                (pRVar3 + (long)(int)(normdev._4_4_ - 1) * 2)[1] = -0x40100000;
              }
              if (ref_geom->max == 0) {
                printf("gref %3d orientation%6.2f inferred from %6.2f %d %d %6.2f \n",
                       *(undefined8 *)(ref_cell->f2n + (long)(int)(normdev._4_4_ - 1) * 2),
                       max_normdev,_positive,(ulong)normdev._4_4_,(ulong)(uint)cell,(ulong)local_60)
                ;
              }
            }
            else {
              pRVar3 = ref_cell->f2n;
              (pRVar3 + (long)(int)(normdev._4_4_ - 1) * 2)[0] = 0;
              (pRVar3 + (long)(int)(normdev._4_4_ - 1) * 2)[1] = 0;
            }
          }
          ref_grid_local._4_4_ = 0;
        }
      }
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_meshlink.c",
           0x3c6,"ref_meshlink_infer_orientation",(ulong)uVar1,"id range");
    ref_grid_local._4_4_ = uVar1;
  }
  return ref_grid_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_meshlink_infer_orientation(REF_GRID ref_grid) {
  REF_MPI ref_mpi = ref_grid_mpi(ref_grid);
  REF_GEOM ref_geom = ref_grid_geom(ref_grid);
  REF_CELL ref_cell = ref_grid_tri(ref_grid);
  REF_INT min_id, max_id, id;
  REF_DBL normdev, min_normdev, max_normdev;
  REF_INT negative, positive;
  REF_INT cell, nodes[REF_CELL_MAX_SIZE_PER];
  RSS(ref_cell_id_range(ref_cell, ref_mpi, &min_id, &max_id), "id range");
  RAS(min_id > 0, "expected min_id greater then zero");
  ref_geom->nface = max_id;
  ref_malloc_init(ref_geom->uv_area_sign, ref_geom->nface, REF_DBL, 1.0);

  for (id = min_id; id <= max_id; id++) {
    min_normdev = 2.0;
    max_normdev = -2.0;
    negative = 0;
    positive = 0;
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      if (id != nodes[ref_cell_id_index(ref_cell)]) continue;
      RSS(ref_geom_tri_norm_deviation(ref_grid, nodes, &normdev), "norm dev");
      min_normdev = MIN(min_normdev, normdev);
      max_normdev = MAX(max_normdev, normdev);
      if (normdev < 0.0) {
        negative++;
      } else {
        positive++;
      }
    }
    normdev = min_normdev;
    RSS(ref_mpi_min(ref_mpi, &normdev, &min_normdev, REF_DBL_TYPE), "mpi max");
    RSS(ref_mpi_bcast(ref_mpi, &min_normdev, 1, REF_DBL_TYPE), "min");
    normdev = max_normdev;
    RSS(ref_mpi_max(ref_mpi, &normdev, &max_normdev, REF_DBL_TYPE), "mpi max");
    RSS(ref_mpi_bcast(ref_mpi, &max_normdev, 1, REF_DBL_TYPE), "max");
    RSS(ref_mpi_allsum(ref_mpi, &positive, 1, REF_INT_TYPE), "mpi sum");
    RSS(ref_mpi_allsum(ref_mpi, &negative, 1, REF_INT_TYPE), "mpi sum");
    if (min_normdev > 1.5 && max_normdev < -1.5) {
      ref_geom->uv_area_sign[id - 1] = 0.0;
    } else {
      if (positive < negative) ref_geom->uv_area_sign[id - 1] = -1.0;
      if (ref_mpi_once(ref_mpi))
        printf("gref %3d orientation%6.2f inferred from %6.2f %d %d %6.2f \n",
               id, ref_geom->uv_area_sign[id - 1], min_normdev, negative,
               positive, max_normdev);
    }
  }

  return REF_SUCCESS;
}